

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

void __thiscall toml::detail::location::retrace(location *this,difference_type n)

{
  difference_type dVar1;
  char local_31;
  char *local_30;
  char *local_28;
  char *local_20;
  difference_type local_18;
  difference_type n_local;
  location *this_local;
  
  local_28 = (this->iter_)._M_current;
  local_18 = n;
  n_local = (difference_type)this;
  local_20 = (char *)std::
                     prev<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                               ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                 )local_28,n);
  local_30 = (this->iter_)._M_current;
  local_31 = '\n';
  dVar1 = std::
          count<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char>
                    ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     local_20,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                               )local_30,&local_31);
  this->line_number_ = this->line_number_ - dVar1;
  __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::operator-=
            (&this->iter_,local_18);
  return;
}

Assistant:

void retrace(difference_type n = 1) noexcept
    {
        this->line_number_ -= static_cast<std::size_t>(
                std::count(std::prev(this->iter_, n), this->iter_, '\n'));
        this->iter_ -= n;
        return;
    }